

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O3

void tree_sitter_haskell_external_scanner_deserialize(void *payload,char *buffer,uint length)

{
  uint uVar1;
  uint uVar2;
  undefined8 uVar3;
  char *pcVar4;
  void *pvVar5;
  uint uVar6;
  uint *puVar7;
  uint local_48;
  undefined1 auStack_44 [4];
  undefined8 uStack_40;
  undefined4 local_38;
  
  puVar7 = &local_48;
  if (length == 0) {
    pcVar4 = auStack_44;
    uStack_40 = 0;
    local_38 = 0;
    _local_48 = 0x300000000;
  }
  else {
    pcVar4 = buffer + 4;
    puVar7 = (uint *)buffer;
  }
  uVar1 = *puVar7;
  uVar3 = *(undefined8 *)(pcVar4 + 8);
  *(undefined8 *)((long)payload + 0x10) = *(undefined8 *)pcVar4;
  *(undefined8 *)((long)payload + 0x18) = uVar3;
  uVar2 = *puVar7;
  uVar6 = uVar2;
  if (*(uint *)((long)payload + 0xc) < uVar2) {
    if (*payload == (void *)0x0) {
      pvVar5 = malloc((ulong)uVar2 * 8);
    }
    else {
      pvVar5 = realloc(*payload,(ulong)uVar2 * 8);
      uVar6 = *puVar7;
    }
    *(void **)payload = pvVar5;
    *(uint *)((long)payload + 0xc) = uVar2;
  }
  *(uint *)((long)payload + 8) = uVar6;
  if (length != 0) {
    memcpy(*payload,buffer + 0x14,(ulong)(uVar1 << 3));
  }
  *(undefined4 *)((long)payload + 0x28) = 0;
  *(undefined4 *)((long)payload + 0x30) = 0;
  if (*(uint *)((long)payload + 0x2c) < 8) {
    if (*(void **)((long)payload + 0x20) == (void *)0x0) {
      pvVar5 = malloc(0x20);
    }
    else {
      pvVar5 = realloc(*(void **)((long)payload + 0x20),0x20);
    }
    *(void **)((long)payload + 0x20) = pvVar5;
    *(undefined4 *)((long)payload + 0x2c) = 8;
  }
  return;
}

Assistant:

void tree_sitter_haskell_external_scanner_deserialize(void *payload, const char *buffer, unsigned length) {
  State *state = (State *) payload;
  Persist p;
  Persist *persist;
  if (length > 0)
    persist = (Persist *) buffer;
  else {
    p = (Persist) {.contexts = 0};
    persist = &p;
    persist->newline.state = NResume;
  }
  unsigned contexts_size = persist->contexts * sizeof(Context);
  state->newline = persist->newline;
  array_reserve(&state->contexts, persist->contexts);
  state->contexts.size = persist->contexts;
  if (length > 0)
    memcpy(state->contexts.contents, buffer + sizeof(Persist), contexts_size);
  state->lookahead.size = 0;
  state->lookahead.offset = 0;
  array_reserve(&state->lookahead, 8);
#ifdef TREE_SITTER_DEBUG
  if (length > 0)
    deserialize_parse_lines(buffer + sizeof(Persist) + contexts_size, &state->parse, persist->parse);
#endif
}